

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FieldDescriptor * __thiscall
google::protobuf::DescriptorPool::FindExtensionByNumber
          (DescriptorPool *this,Descriptor *extendee,int number)

{
  bool bVar1;
  Tables *pTVar2;
  FieldDescriptor *pFVar3;
  MutexLockMaybe lock;
  MutexLockMaybe local_30;
  
  internal::MutexLockMaybe::MutexLockMaybe(&local_30,this->mutex_);
  pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                     (&this->tables_);
  pFVar3 = Tables::FindExtension(pTVar2,extendee,number);
  if (pFVar3 == (FieldDescriptor *)0x0) {
    if (this->underlay_ != (DescriptorPool *)0x0) {
      pFVar3 = FindExtensionByNumber(this->underlay_,extendee,number);
      if (pFVar3 != (FieldDescriptor *)0x0) goto LAB_001dd7d9;
    }
    bVar1 = TryFindExtensionInFallbackDatabase(this,extendee,number);
    if (bVar1) {
      pTVar2 = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->
                         (&this->tables_);
      pFVar3 = Tables::FindExtension(pTVar2,extendee,number);
      if (pFVar3 != (FieldDescriptor *)0x0) goto LAB_001dd7d9;
    }
    pFVar3 = (FieldDescriptor *)0x0;
  }
LAB_001dd7d9:
  internal::MutexLockMaybe::~MutexLockMaybe(&local_30);
  return pFVar3;
}

Assistant:

const FieldDescriptor* DescriptorPool::FindExtensionByNumber(
    const Descriptor* extendee, int number) const {
  MutexLockMaybe lock(mutex_);
  const FieldDescriptor* result = tables_->FindExtension(extendee, number);
  if (result != NULL) {
    return result;
  }
  if (underlay_ != NULL) {
    result = underlay_->FindExtensionByNumber(extendee, number);
    if (result != NULL) return result;
  }
  if (TryFindExtensionInFallbackDatabase(extendee, number)) {
    result = tables_->FindExtension(extendee, number);
    if (result != NULL) {
      return result;
    }
  }
  return NULL;
}